

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_ObjSlack(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar1 = Acb_ObjLevelD(p,iObj);
  iVar2 = Acb_ObjLevelR(p,iObj);
  uVar3 = Acb_ObjIsCio(p,iObj);
  if (iVar2 + iVar1 <= (int)((uVar3 ^ 1) + p->LevelMax)) {
    uVar3 = Acb_ObjIsCio(p,iObj);
    return (uVar3 ^ 1) + (p->LevelMax - (iVar2 + iVar1));
  }
  __assert_fail("!Acb_ObjIsCio(p, iObj) + p->LevelMax >= LevelSum",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                ,0xab,"int Acb_ObjSlack(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_ObjSlack( Acb_Ntk_t * p, int iObj )
{
    int LevelSum = Acb_ObjLevelD(p, iObj) + Acb_ObjLevelR(p, iObj);
    assert( !Acb_ObjIsCio(p, iObj) + p->LevelMax >= LevelSum );
    return !Acb_ObjIsCio(p, iObj) + p->LevelMax - LevelSum;
}